

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O1

HalfCycles __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::perform_machine_cycle
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this,
          PartialMachineCycle *cycle)

{
  TMS9918<(TI::TMS::Personality)0> *this_00;
  atomic_flag *paVar1;
  HalfCycles *pHVar2;
  HandledSlot *this_01;
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_false,_false>
  *this_02;
  tuple<Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_> this_03;
  __atomic_flag_data_type _Var3;
  uint8_t uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  Operation OVar8;
  pointer pcVar9;
  _Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_> _Var10;
  IntType IVar11;
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> this_04;
  bool bVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint8_t *puVar17;
  ssize_t sVar18;
  MemorySlot *pMVar19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar20;
  uint8_t *puVar21;
  uint16_t uVar22;
  uint *puVar23;
  byte *pbVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  HalfCycles HVar30;
  WrappedInt<HalfCycles> WVar31;
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar32;
  unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
  new_speed;
  undefined1 local_60 [16];
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> local_50;
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> local_48;
  ulong local_40;
  string *local_38;
  
  WVar31.length_._4_4_ = 0;
  WVar31.length_._0_4_ = (uint)(cycle->operation == ReadOpcode) * 2;
  lVar27 = (cycle->length).super_WrappedInt<HalfCycles>.length_ + WVar31.length_;
  HVar30.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)
       ((this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ + lVar27);
  (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
       (IntType)HVar30.super_WrappedInt<HalfCycles>.length_;
  (this->vdp_).is_flushed_ = false;
  lVar16 = (this->vdp_).time_until_event_.super_WrappedInt<HalfCycles>.length_;
  lVar15 = lVar16 - lVar27;
  (this->vdp_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = lVar15;
  if (lVar15 == 0 || lVar16 < lVar27) {
    (this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = lVar15;
    (this->vdp_).is_flushed_ = true;
    (this->vdp_).did_flush_ = true;
    (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
    this_00 = &(this->vdp_).object_;
    TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(this_00,HVar30);
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
    update_sequence_point(&this->vdp_);
    LOCK();
    paVar1 = &(this->vdp_).flush_concurrency_check_;
    _Var3 = (paVar1->super___atomic_flag_base)._M_i;
    (paVar1->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var3 != false) {
      __assert_fail("!flush_concurrency_check_.test_and_set()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/MSX/../../ClockReceiver/JustInTime.hpp"
                    ,0x7e,
                    "auto JustInTimeActor<TI::TMS::TMS9918<TI::TMS::TMS9918A>>::operator->() [T = TI::TMS::TMS9918<TI::TMS::TMS9918A>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                   );
    }
    if ((this->vdp_).is_flushed_ == false) {
      (this->vdp_).is_flushed_ = true;
      (this->vdp_).did_flush_ = true;
      HVar30.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(this_00,HVar30);
    }
    LOCK();
    (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    local_60._0_8_ = &this->vdp_;
    local_60._8_8_ = this_00;
    bVar12 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(this_00);
    if ((this->z80_).super_ProcessorBase.super_ProcessorStorage.irq_line_ != bVar12) {
      lVar16 = (this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_;
      (this->z80_).super_ProcessorBase.super_ProcessorStorage.irq_line_ = bVar12;
      if ((bVar12) && ((this->z80_).super_ProcessorBase.super_ProcessorStorage.iff1_ == true)) {
        puVar17 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
        *puVar17 = *puVar17 | 1;
      }
      else {
        puVar17 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
        *puVar17 = *puVar17 & 0xfe;
      }
      if (lVar16 < -1) {
        (this->z80_).super_ProcessorBase.super_ProcessorStorage.last_request_status_ =
             (this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_ & 1 |
             (this->z80_).super_ProcessorBase.super_ProcessorStorage.last_request_status_ & 0xfe;
      }
    }
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_60);
  }
  lVar16 = (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ + lVar27;
  (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar16;
  pHVar2 = &this->memory_slots_[0].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar27;
  pHVar2 = &this->memory_slots_[1].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar27;
  pHVar2 = &this->memory_slots_[2].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar27;
  pHVar2 = &this->memory_slots_[3].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar27;
  OVar8 = cycle->operation;
  if (8 < (int)OVar8) goto switchD_0034a6eb_caseD_9a;
  if (cycle->address == (ushort *)0x0) {
    uVar28 = 0;
  }
  else {
    uVar28 = (ulong)*cycle->address;
  }
  if (Interrupt < OVar8) goto switchD_0034a6eb_caseD_9a;
  this_01 = this->memory_slots_;
  uVar22 = (uint16_t)uVar28;
  uVar29 = (uint)uVar28;
  switch(OVar8) {
  case ReadOpcode:
    if (this->use_fast_tape_ == true) {
      if (uVar22 == 0) {
LAB_0034a9c2:
        this->pc_zero_accesses_ = this->pc_zero_accesses_ + 1;
      }
      else {
        if (uVar29 == 0x1abc) {
          puVar17 = ram(this);
          local_60[0] = (Parser)puVar17[0xfca4];
          puVar17 = ram(this);
          local_60[1] = puVar17[0xfca5];
          iVar14 = Storage::Tape::MSX::Parser::get_byte((FileSpeed *)local_60,&this->tape_player_);
          if (iVar14 >= 0) {
            CPU::Z80::ProcessorBase::set_value_of
                      (&(this->z80_).super_ProcessorBase,A,(uint16_t)iVar14);
          }
          CPU::Z80::ProcessorBase::set_value_of
                    (&(this->z80_).super_ProcessorBase,Flags,(ushort)(iVar14 < 0));
          *cycle->value = 0xc9;
          goto switchD_0034a6eb_caseD_9a;
        }
        if (uVar29 == 0x1a63) {
          puVar17 = (this->i8255_).outputs_ + 2;
          *puVar17 = *puVar17 & 0xef;
          Intel::i8255::
          i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
          ::update_outputs(&this->i8255_);
          this_02 = &this->z80_;
          CPU::Z80::ProcessorBase::set_value_of(&this_02->super_ProcessorBase,IFF1,0);
          CPU::Z80::ProcessorBase::set_value_of(&this_02->super_ProcessorBase,IFF2,0);
          Storage::Tape::MSX::Parser::find_header((Parser *)local_60,&this->tape_player_);
          bVar12 = (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   local_60._0_8_ ==
                   (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   0x0;
          if (!bVar12) {
            uVar4 = *(uint8_t *)local_60._0_8_;
            puVar17 = ram(this);
            puVar17[0xfca4] = uVar4;
            uVar4 = *(uint8_t *)(local_60._0_8_ + 1);
            puVar17 = ram(this);
            puVar17[0xfca5] = uVar4;
          }
          CPU::Z80::ProcessorBase::set_value_of(&this_02->super_ProcessorBase,Flags,(ushort)bVar12);
          *cycle->value = 0xc9;
          if ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
              local_60._0_8_ !=
              (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)0x0) {
            operator_delete((void *)local_60._0_8_,2);
          }
          goto switchD_0034a6eb_caseD_9a;
        }
      }
    }
    else if (uVar22 == 0) goto LAB_0034a9c2;
    this->pc_address_ = uVar22;
    break;
  case Write:
    if ((uVar22 == 0xffff) &&
       ((this->final_slot_->super_PrimarySlot).supports_secondary_paging == true)) {
      PrimarySlot::set_secondary_paging(&this->final_slot_->super_PrimarySlot,*cycle->value);
      update_paging(this);
    }
    else {
      uVar25 = this->primary_slots_ >> ((byte)(uVar28 >> 0xd) & 6) & 3;
      if ((MemorySlotHandler *)
          this->memory_slots_[uVar25].handler._M_t.
          super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
          ._M_t.
          super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
          .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false> == (MemorySlotHandler *)0x0) {
        this->write_pointers_[uVar28 >> 0xd][uVar29 & 0x1fff] = *cycle->value;
        local_50._M_head_impl = (Flywheel *)cycle;
      }
      else {
        lVar15 = lVar16 + 3;
        if (-1 < lVar16) {
          lVar15 = lVar16;
        }
        (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar16 % 4;
        local_50._M_head_impl = (Flywheel *)cycle;
        local_40 = uVar28;
        Outputs::Speaker::
        PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>
        ::run_for(&(this->speaker_).speaker,&(this->speaker_).audio_queue,(Cycles)(lVar15 >> 2));
        _Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
             this_01[uVar25].handler._M_t.
             super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
             .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
        IVar11 = this_01[uVar25].cycles_since_update.super_WrappedInt<HalfCycles>.length_;
        this_01[uVar25].cycles_since_update.super_WrappedInt<HalfCycles>.length_ = 0;
        (**(code **)(*(long *)_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,IVar11
                  );
        cycle = (PartialMachineCycle *)local_50._M_head_impl;
        _Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
             this_01[uVar25].handler._M_t.
             super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
             .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
        local_48._M_head_impl._0_4_ =
             (uint)**(byte **)&(local_50._M_head_impl)->number_of_surprises_;
        uVar29 = (uint)(this->pc_address_ >> 0xd);
        puVar17 = this->read_pointers_[uVar29];
        puVar21 = PrimarySlot::read_pointer(&this_01->super_PrimarySlot,uVar29);
        (**(code **)(*(long *)_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                              _M_head_impl + 0x18))
                  (_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,
                   local_40,(ulong)local_48._M_head_impl & 0xffffffff,puVar17 != puVar21);
      }
    }
    goto switchD_0034a6eb_caseD_9a;
  case Input:
    uVar25 = uVar29 & 0xff;
    if (0x13 < uVar25 - 0x98) {
      if (uVar25 == 0xb5) goto switchD_0034a6eb_caseD_9a;
switchD_0034a75e_caseD_9c:
      *cycle->value = 0xff;
      goto switchD_0034a6eb_caseD_9a;
    }
    puVar23 = &switchD_0034a75e::switchdataD_004cd4c4;
    switch(uVar25) {
    case 0x98:
    case 0x99:
      uVar32 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
               operator->((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>
                           *)local_60);
      sVar18 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::read
                         ((TMS9918<(TI::TMS::Personality)0> *)local_60._8_8_,uVar29,
                          uVar32._M_t.
                          super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          .super__Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false>
                          ._M_head_impl,(size_t)puVar23);
      *cycle->value = (uint8_t)sVar18;
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_60);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_60);
      bVar12 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                         ((TMS9918<(TI::TMS::Personality)0> *)local_60._8_8_);
      goto LAB_0034ac35;
    case 0x9a:
    case 0x9b:
      goto switchD_0034a6eb_caseD_9a;
    default:
      goto switchD_0034a75e_caseD_9c;
    case 0xa2:
      lVar15 = lVar16 + 3;
      if (-1 < lVar16) {
        lVar15 = lVar16;
      }
      (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar16 % 4;
      Outputs::Speaker::
      PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>
      ::run_for(&(this->speaker_).speaker,&(this->speaker_).audio_queue,(Cycles)(lVar15 >> 2));
      bVar13 = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&(this->speaker_).ay);
      break;
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
      sVar18 = Intel::i8255::
               i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
               ::read(&this->i8255_,uVar29,
                      (void *)((long)&switchD_0034a75e::switchdataD_004cd4c4 +
                              (long)(int)(&switchD_0034a75e::switchdataD_004cd4c4)[uVar25 - 0x98]),
                      0x4cd4c4);
      bVar13 = (byte)sVar18;
    }
    goto LAB_0034aa0e;
  case Output:
    uVar25 = uVar29 & 0xff;
    puVar23 = &switchD_0034a6eb::switchdataD_004cd44c;
    switch(uVar25) {
    case 0x98:
    case 0x99:
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_60);
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
                ((TMS9918<(TI::TMS::Personality)0> *)local_60._8_8_,uVar29,
                 (void *)(ulong)*cycle->value,(size_t)puVar23);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_60);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_60);
      bVar12 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                         ((TMS9918<(TI::TMS::Personality)0> *)local_60._8_8_);
LAB_0034ac35:
      CPU::Z80::ProcessorBase::set_interrupt_line
                (&(this->z80_).super_ProcessorBase,bVar12,(HalfCycles)0x0);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_60);
      break;
    case 0x9a:
    case 0x9b:
    case 0xb4:
    case 0xb5:
      break;
    case 0xa0:
    case 0xa1:
      lVar15 = lVar16 + 3;
      if (-1 < lVar16) {
        lVar15 = lVar16;
      }
      (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar16 % 4;
      Outputs::Speaker::
      PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>
      ::run_for(&(this->speaker_).speaker,&(this->speaker_).audio_queue,(Cycles)(lVar15 >> 2));
      GI::AY38910::Utility::write<GI::AY38910::AY38910<false>>
                (&(this->speaker_).ay,(uVar29 & 0xff) == 0xa1,*cycle->value);
      break;
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
      Intel::i8255::
      i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>::
      write(&this->i8255_,uVar29,(void *)(ulong)*cycle->value,0x4cd44c);
      break;
    default:
      if (uVar25 - 0xfc < 4) break;
      if (uVar25 - 0x7c < 2) {
        if ((uVar28 & 1) == 0) {
          (this->speaker_).opll.super_OPLBase<Yamaha::OPL::OPLL,_false>.selected_register_ =
               *cycle->value;
        }
        else {
          Yamaha::OPL::OPLL::write_register
                    (&(this->speaker_).opll,
                     (this->speaker_).opll.super_OPLBase<Yamaha::OPL::OPLL,_false>.
                     selected_register_,*cycle->value);
        }
        break;
      }
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb0:
    case 0xb1:
    case 0xb2:
    case 0xb3:
      printf("Unhandled write %02x of %02x\n",(ulong)(uVar29 & 0xff),(ulong)*cycle->value);
    }
    goto switchD_0034a6eb_caseD_9a;
  case Interrupt:
    *cycle->value = 0xff;
    if ((this->input_text_)._M_string_length != 0) {
      local_38 = &this->input_text_;
      this_03.
      super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
      .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           )(this->memory_slots_ + 3);
      uVar28 = 0;
      local_50._M_head_impl = (Flywheel *)cycle;
      pMVar19 = PrimarySlot::subslot
                          ((PrimarySlot *)
                           this_03.
                           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
      pvVar20 = MemorySlot::source(pMVar19);
      uVar5 = (pvVar20->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[0xf3fa];
      pMVar19 = PrimarySlot::subslot
                          ((PrimarySlot *)
                           this_03.
                           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
      pvVar20 = MemorySlot::source(pMVar19);
      uVar6 = (pvVar20->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[0xf3fb];
      pMVar19 = PrimarySlot::subslot
                          ((PrimarySlot *)
                           this_03.
                           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
      pvVar20 = MemorySlot::source(pMVar19);
      uVar7 = (pvVar20->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[0xf3f8];
      local_48._M_head_impl =
           (Flywheel *)
           this_03.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
      pMVar19 = PrimarySlot::subslot
                          ((PrimarySlot *)
                           this_03.
                           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
      pvVar20 = MemorySlot::source(pMVar19);
      iVar14 = CONCAT11((pvVar20->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_start[0xf3f9],uVar7) - 0xfbf0;
      while ((uVar28 < (this->input_text_)._M_string_length &&
             (iVar26 = (iVar14 + 1) % 0x28, iVar26 != CONCAT11(uVar6,uVar5) - 0xfbf0))) {
        local_40 = CONCAT71(local_40._1_7_,(local_38->_M_dataplus)._M_p[uVar28]);
        pMVar19 = PrimarySlot::subslot((PrimarySlot *)local_48._M_head_impl,0);
        pvVar20 = MemorySlot::source(pMVar19);
        (pvVar20->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[(long)iVar14 + 0xfbf0] = (uchar)local_40;
        uVar28 = uVar28 + 1;
        iVar14 = iVar26;
      }
      if ((this->input_text_)._M_string_length == uVar28) {
        pcVar9 = (this->input_text_)._M_dataplus._M_p;
        (this->input_text_)._M_string_length = 0;
        *pcVar9 = '\0';
      }
      else {
        std::__cxx11::string::_M_erase((ulong)local_38,0);
      }
      this_04._M_head_impl = local_48._M_head_impl;
      cycle = (PartialMachineCycle *)local_50._M_head_impl;
      pMVar19 = PrimarySlot::subslot((PrimarySlot *)local_48._M_head_impl,0);
      pvVar20 = MemorySlot::source(pMVar19);
      (pvVar20->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[0xf3f8] = (uchar)(iVar14 + 0xfbf0);
      pMVar19 = PrimarySlot::subslot((PrimarySlot *)this_04._M_head_impl,0);
      pvVar20 = MemorySlot::source(pMVar19);
      (pvVar20->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[0xf3f9] = (uchar)((uint)(iVar14 + 0xfbf0) >> 8);
    }
    goto switchD_0034a6eb_caseD_9a;
  }
  if ((uVar22 == 0xffff) &&
     ((this->final_slot_->super_PrimarySlot).supports_secondary_paging == true)) {
    bVar13 = PrimarySlot::secondary_paging(&this->final_slot_->super_PrimarySlot);
    bVar13 = ~bVar13;
LAB_0034aa0e:
    pbVar24 = cycle->value;
  }
  else {
    if (this->read_pointers_[uVar28 >> 0xd] != (uint8_t *)0x0) {
      bVar13 = this->read_pointers_[uVar28 >> 0xd][uVar29 & 0x1fff];
      goto LAB_0034aa0e;
    }
    uVar29 = this->primary_slots_ >> ((byte)(uVar28 >> 0xd) & 6) & 3;
    _Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
         this->memory_slots_[uVar29].handler._M_t.
         super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
         ._M_t.
         super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
         .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
    IVar11 = this->memory_slots_[uVar29].cycles_since_update.super_WrappedInt<HalfCycles>.length_;
    this->memory_slots_[uVar29].cycles_since_update.super_WrappedInt<HalfCycles>.length_ = 0;
    (**(code **)(*(long *)_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl
                + 0x10))
              (_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,IVar11);
    _Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
         this->memory_slots_[uVar29].handler._M_t.
         super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
         ._M_t.
         super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
         .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
    bVar13 = (**(code **)(*(long *)_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                                   _M_head_impl + 0x20))
                       (_Var10.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,
                        uVar28);
    pbVar24 = cycle->value;
  }
  *pbVar24 = bVar13;
switchD_0034a6eb_caseD_9a:
  if (this->tape_player_is_sleeping_ == false) {
    Storage::Tape::BinaryTapePlayer::run_for
              (&this->tape_player_,
               (Cycles)(long)(int)(((HalfCycles *)((long)cycle + 8))->super_WrappedInt<HalfCycles>).
                                  length_);
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)WVar31.length_;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			// Per the best information I currently have, the MSX inserts an extra cycle into each opcode read,
			// but otherwise runs without pause.
			const HalfCycles addition((cycle.operation == CPU::Z80::PartialMachineCycle::ReadOpcode) ? 2 : 0);
			const HalfCycles total_length = addition + cycle.length;
			if(vdp_ += total_length) {
				z80_.set_interrupt_line(vdp_->get_interrupt_line(), vdp_.last_sequence_point_overrun());
			}
			time_since_ay_update_ += total_length;
			memory_slots_[0].cycles_since_update += total_length;
			memory_slots_[1].cycles_since_update += total_length;
			memory_slots_[2].cycles_since_update += total_length;
			memory_slots_[3].cycles_since_update += total_length;

			if constexpr (model >= Target::Model::MSX2) {
				clock_.run_for(total_length);
			}

			if(cycle.is_terminal()) {
				uint16_t address = cycle.address ? *cycle.address : 0x0000;
				switch(cycle.operation) {
					case CPU::Z80::PartialMachineCycle::ReadOpcode:
						if(use_fast_tape_) {
							if(address == 0x1a63) {
								// TAPION

								// Enable the tape motor.
								i8255_.write(0xab, 0x8);

								// Disable interrupts.
								z80_.set_value_of(CPU::Z80::Register::IFF1, 0);
								z80_.set_value_of(CPU::Z80::Register::IFF2, 0);

								// Use the parser to find a header, and if one is found then populate
								// LOWLIM and WINWID, and reset carry. Otherwise set carry.
								using Parser = Storage::Tape::MSX::Parser;
								std::unique_ptr<Parser::FileSpeed> new_speed = Parser::find_header(tape_player_);
								if(new_speed) {
									ram()[0xfca4] = new_speed->minimum_start_bit_duration;
									ram()[0xfca5] = new_speed->low_high_disrimination_duration;
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}

							if(address == 0x1abc) {
								// TAPIN

								// Grab the current values of LOWLIM and WINWID.
								using Parser = Storage::Tape::MSX::Parser;
								Parser::FileSpeed tape_speed;
								tape_speed.minimum_start_bit_duration = ram()[0xfca4];
								tape_speed.low_high_disrimination_duration = ram()[0xfca5];

								// Ask the tape parser to grab a byte.
								int next_byte = Parser::get_byte(tape_speed, tape_player_);

								// If a byte was found, return it with carry unset. Otherwise set carry to
								// indicate error.
								if(next_byte >= 0) {
									z80_.set_value_of(CPU::Z80::Register::A, uint16_t(next_byte));
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}
						}

						if(!address) {
							pc_zero_accesses_++;
						}

						// TODO: below relates to confidence measurements. Reinstate, somehow.
//						if(is_unpopulated_[address >> 13] == unpopulated_) {
//							performed_unmapped_access_ = true;
//						}

						pc_address_ = address;	// This is retained so as to be able to name the source of an access to cartridge handlers.
						[[fallthrough]];

					case CPU::Z80::PartialMachineCycle::Read:
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							*cycle.value = final_slot_->secondary_paging() ^ 0xff;
							break;
						}

						if(read_pointers_[address >> 13]) {
							*cycle.value = read_pointers_[address >> 13][address & 8191];
						} else {
							const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							*cycle.value = memory_slots_[slot_hit].handler->read(address);
						}
					break;

					case CPU::Z80::PartialMachineCycle::Write: {
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							final_slot_->set_secondary_paging(*cycle.value);
							update_paging();
							break;
						}

						const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
						if(memory_slots_[slot_hit].handler) {
							update_audio();
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							memory_slots_[slot_hit].handler->write(
								address,
								*cycle.value,
								read_pointers_[pc_address_ >> 13] != memory_slots_[0].read_pointer(pc_address_ >> 13));
						} else {
							write_pointers_[address >> 13][address & 8191] = *cycle.value;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Input:
						switch(address & 0xff) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								*cycle.value = vdp_->read(address);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa2:
								update_audio();
								*cycle.value = GI::AY38910::Utility::read(speaker_.ay);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								*cycle.value = i8255_.read(address);
							break;

							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								*cycle.value = clock_.read(next_clock_register_);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff:
								if constexpr (model != Target::Model::MSX1) {
									*cycle.value = ram_mapper_[(address & 0xff) - 0xfc];
									break;
								}
								[[fallthrough]];

							default:
//								printf("Unhandled read %02x\n", address & 0xff);
								*cycle.value = 0xff;
							break;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Output: {
						const int port = address & 0xff;
						switch(port) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								vdp_->write(address, *cycle.value);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa0:	case 0xa1:
								update_audio();
								GI::AY38910::Utility::write(speaker_.ay, port == 0xa1, *cycle.value);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								i8255_.write(address, *cycle.value);
							break;

							case 0xb4:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								next_clock_register_ = *cycle.value;
							break;
							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								clock_.write(next_clock_register_, *cycle.value);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff: {
								if constexpr (model == Target::Model::MSX1) {
									break;
								}

								ram_mapper_[port - 0xfc] = *cycle.value;

								// Apply to RAM.
								//
								// On a real MSX this may also affect other slots.
								// I've not yet needed it to propagate further, so
								// have not implemented any onward route.
								const uint16_t region = uint16_t((port - 0xfc) << 14);
								const size_t base = size_t(*cycle.value) << 14;
								if(base < RAMSize) {
									ram_slot().template map<MemorySlot::AccessType::ReadWrite>(base, region, 0x4000);
								} else {
									ram_slot().unmap(region, 0x4000);
								}

								update_paging();
							} break;

							case 0x7c:	case 0x7d:
								if constexpr (has_opll) {
									speaker_.opll.write(address, *cycle.value);
									break;
								}
								[[fallthrough]];

							default:
								printf("Unhandled write %02x of %02x\n", address & 0xff, *cycle.value);
							break;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Interrupt:
						*cycle.value = 0xff;

						// Take this as a convenient moment to jump into the keyboard buffer, if desired.
						if(!input_text_.empty()) {
							// The following are KEYBUF per the Red Book; its address and its definition as DEFS 40.
							const int buffer_start = 0xfbf0;
							const int buffer_size = 40;

							// Also from the Red Book: GETPNT is at F3FAH and PUTPNT is at F3F8H.
							int read_address = ram()[0xf3fa] | (ram()[0xf3fb] << 8);
							int write_address = ram()[0xf3f8] | (ram()[0xf3f9] << 8);

							// Write until either the string is exhausted or the write_pointer is immediately
							// behind the read pointer; temporarily map write_address and read_address into
							// buffer-relative values.
							std::size_t characters_written = 0;
							write_address -= buffer_start;
							read_address -= buffer_start;
							while(characters_written < input_text_.size()) {
								const int next_write_address = (write_address + 1) % buffer_size;
								if(next_write_address == read_address) break;
								ram()[write_address + buffer_start] = uint8_t(input_text_[characters_written]);
								++characters_written;
								write_address = next_write_address;
							}
							input_text_.erase(input_text_.begin(), input_text_.begin() + std::string::difference_type(characters_written));

							// Map the write address back into absolute terms and write it out again as PUTPNT.
							write_address += buffer_start;
							ram()[0xf3f8] = uint8_t(write_address);
							ram()[0xf3f9] = uint8_t(write_address >> 8);
						}
					break;

					default: break;
				}
			}

			if(!tape_player_is_sleeping_)
				tape_player_.run_for(int(cycle.length.as_integral()));

			return addition;
		}